

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O2

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::textData(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           *this,ParserChar *text,size_t textLength)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  _Elt_pointer pEVar4;
  const_iterator cVar5;
  _Base_ptr p_Var6;
  INamespaceHandler *pIVar7;
  ElementFunctionMap *this_00;
  long *plVar8;
  ElementData elementData;
  StringHash SStack_40;
  size_t local_38;
  void *pvStack_30;
  
  bVar1 = true;
  if (this->mIgnoreElements == 0) {
    if (this->mUnknownElements == 0) {
      if (this->mNamespaceElements != 0) {
        pIVar7 = this->mActiveNamespaceHandler;
        goto LAB_006fe34f;
      }
      pEVar4 = (this->super_ParserTemplateBase).mElementDataStack.
               super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pEVar4 != (this->super_ParserTemplateBase).mElementDataStack.
                    super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (pEVar4 == (this->super_ParserTemplateBase).mElementDataStack.
                      super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pEVar4 = (this->super_ParserTemplateBase).mElementDataStack.
                   super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        SStack_40 = pEVar4[-1].generatedElementHash;
        local_38 = pEVar4[-1].typeID;
        pvStack_30 = pEVar4[-1].validationData;
        this_00 = &this->mElementFunctionMap;
        if (this->mCurrentElementFunctionMap != (ElementFunctionMap *)0x0) {
          this_00 = this->mCurrentElementFunctionMap;
        }
        cVar5 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>,_std::_Select1st<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                ::find(&this_00->_M_t,&SStack_40);
        if ((_Rb_tree_header *)cVar5._M_node == &(this_00->_M_t)._M_impl.super__Rb_tree_header) {
          return true;
        }
        p_Var6 = cVar5._M_node[1]._M_right;
        if (p_Var6 != (_Base_ptr)0x0) {
          plVar8 = (long *)((long)&(this->super_ParserTemplateBase).super_Parser._vptr_Parser +
                           *(long *)(cVar5._M_node + 2));
          if (((ulong)p_Var6 & 1) != 0) {
            p_Var6 = *(_Base_ptr *)(*plVar8 + -1 + (long)p_Var6);
          }
          uVar2 = (*(code *)p_Var6)(plVar8,text,textLength);
          return (bool)uVar2;
        }
      }
      bVar1 = false;
    }
    else {
      pIVar7 = (INamespaceHandler *)this->mUnknownHandler;
      if (pIVar7 != (INamespaceHandler *)0x0) {
LAB_006fe34f:
        iVar3 = (*(*(_func_int ***)pIVar7)[4])(pIVar7,text,textLength);
        return SUB41(iVar3,0);
      }
    }
  }
  return bVar1;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::textData(const ParserChar* text,
															  size_t textLength)
	{
        if ( mIgnoreElements > 0 )
        {
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->textData( text, textLength );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            return mActiveNamespaceHandler->textData( text, textLength );
        }

        if ( mElementDataStack.empty() )
            return false;
        ElementData elementData = mElementDataStack.back();
        typename ElementFunctionMap::const_iterator it;

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
		it = functionMapToUse->find(elementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
			return true;
		const FunctionStruct& functions = it->second;

		if ( !functions.textDataFunction || !(static_cast<DerivedClass*>(this)->*functions.textDataFunction)(text, textLength) )
			return false;

		return true;
	}